

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t intersect_skewed_uint16
                  (uint16_t *small,size_t size_s,uint16_t *large,size_t size_l,uint16_t *buffer)

{
  uint16_t target3_00;
  uint16_t target4_00;
  uint16_t uVar1;
  uint16_t uVar2;
  int32_t iVar3;
  int32_t index;
  uint16_t val_s;
  uint16_t target2_1;
  uint16_t target1_1;
  uint16_t target4;
  uint16_t target3;
  uint16_t target2;
  uint16_t target1;
  int32_t index4;
  int32_t index3;
  int32_t index2;
  int32_t index1;
  size_t idx_s;
  size_t idx_l;
  size_t pos;
  uint16_t *buffer_local;
  size_t size_l_local;
  uint16_t *large_local;
  size_t size_s_local;
  uint16_t *small_local;
  
  idx_l = 0;
  idx_s = 0;
  _index2 = (uint16_t *)0x0;
  if (size_s == 0) {
    small_local._4_4_ = 0;
  }
  else {
    index3 = 0;
    index4 = 0;
    _target2 = 0;
    _target4 = 0;
    pos = (size_t)buffer;
    buffer_local = (uint16_t *)size_l;
    size_l_local = (size_t)large;
    large_local = (uint16_t *)size_s;
    size_s_local = (size_t)small;
    while( true ) {
      if (large_local < _index2 + 2 || buffer_local <= idx_s) break;
      uVar1 = *(uint16_t *)(size_s_local + (long)_index2 * 2);
      uVar2 = *(uint16_t *)(size_s_local + 2 + (long)_index2 * 2);
      target3_00 = *(uint16_t *)(size_s_local + 4 + (long)_index2 * 2);
      target4_00 = *(uint16_t *)(size_s_local + 6 + (long)_index2 * 2);
      binarySearch4((uint16_t *)(size_l_local + idx_s * 2),(int)buffer_local - (int)idx_s,uVar1,
                    uVar2,target3_00,target4_00,&index3,&index4,(int32_t *)&target2,
                    (int32_t *)&target4);
      if (((uint16_t *)((long)index3 + idx_s) < buffer_local) &&
         (*(uint16_t *)(size_l_local + (idx_s + (long)index3) * 2) == uVar1)) {
        *(uint16_t *)(pos + idx_l * 2) = uVar1;
        idx_l = idx_l + 1;
      }
      if (((uint16_t *)((long)index4 + idx_s) < buffer_local) &&
         (*(uint16_t *)(size_l_local + (idx_s + (long)index4) * 2) == uVar2)) {
        *(uint16_t *)(pos + idx_l * 2) = uVar2;
        idx_l = idx_l + 1;
      }
      if (((uint16_t *)((long)_target2 + idx_s) < buffer_local) &&
         (*(uint16_t *)(size_l_local + (idx_s + (long)_target2) * 2) == target3_00)) {
        *(uint16_t *)(pos + idx_l * 2) = target3_00;
        idx_l = idx_l + 1;
      }
      if (((uint16_t *)((long)_target4 + idx_s) < buffer_local) &&
         (*(uint16_t *)(size_l_local + (idx_s + (long)_target4) * 2) == target4_00)) {
        *(uint16_t *)(pos + idx_l * 2) = target4_00;
        idx_l = idx_l + 1;
      }
      _index2 = _index2 + 2;
      idx_s = (long)_target4 + idx_s;
    }
    if ((_index2 + 1 <= large_local) && (idx_s < buffer_local)) {
      uVar1 = *(uint16_t *)(size_s_local + (long)_index2 * 2);
      uVar2 = *(uint16_t *)(size_s_local + 2 + (long)_index2 * 2);
      binarySearch2((uint16_t *)(size_l_local + idx_s * 2),(int)buffer_local - (int)idx_s,uVar1,
                    uVar2,&index3,&index4);
      if (((uint16_t *)((long)index3 + idx_s) < buffer_local) &&
         (*(uint16_t *)(size_l_local + (idx_s + (long)index3) * 2) == uVar1)) {
        *(uint16_t *)(pos + idx_l * 2) = uVar1;
        idx_l = idx_l + 1;
      }
      if (((uint16_t *)((long)index4 + idx_s) < buffer_local) &&
         (*(uint16_t *)(size_l_local + (idx_s + (long)index4) * 2) == uVar2)) {
        *(uint16_t *)(pos + idx_l * 2) = uVar2;
        idx_l = idx_l + 1;
      }
      _index2 = _index2 + 1;
      idx_s = (long)index4 + idx_s;
    }
    if ((_index2 < large_local) && (idx_s < buffer_local)) {
      uVar1 = *(uint16_t *)(size_s_local + (long)_index2 * 2);
      iVar3 = binarySearch((uint16_t *)(size_l_local + idx_s * 2),(int)buffer_local - (int)idx_s,
                           uVar1);
      if (-1 < iVar3) {
        *(uint16_t *)(pos + idx_l * 2) = uVar1;
        idx_l = idx_l + 1;
      }
    }
    small_local._4_4_ = (int32_t)idx_l;
  }
  return small_local._4_4_;
}

Assistant:

int32_t intersect_skewed_uint16(const uint16_t *small, size_t size_s,
                                         const uint16_t *large, size_t size_l,
                                         uint16_t *buffer) {
  size_t pos = 0, idx_l = 0, idx_s = 0;

  if (0 == size_s) {
    return 0;
  }
  int32_t index1 = 0, index2 = 0, index3 = 0, index4 = 0;
  while ((idx_s + 4 <= size_s) && (idx_l < size_l)) {
    uint16_t target1 = small[idx_s];
    uint16_t target2 = small[idx_s + 1];
    uint16_t target3 = small[idx_s + 2];
    uint16_t target4 = small[idx_s + 3];
    binarySearch4(large + idx_l, (int32_t)(size_l - idx_l), target1, target2, target3,
                  target4, &index1, &index2, &index3, &index4);
    if ((index1 + idx_l < size_l) && (large[idx_l + index1] == target1)) {
      buffer[pos++] = target1;
    }
    if ((index2 + idx_l < size_l) && (large[idx_l + index2] == target2)) {
      buffer[pos++] = target2;
    }
    if ((index3 + idx_l < size_l) && (large[idx_l + index3] == target3)) {
      buffer[pos++] = target3;
    }
    if ((index4 + idx_l < size_l) && (large[idx_l + index4] == target4)) {
      buffer[pos++] = target4;
    }
    idx_s += 4;
    idx_l += index4;
  }
  if ((idx_s + 2 <= size_s) && (idx_l < size_l)) {
    uint16_t target1 = small[idx_s];
    uint16_t target2 = small[idx_s + 1];
    binarySearch2(large + idx_l, (int32_t)(size_l - idx_l), target1, target2, &index1,
                  &index2);
    if ((index1 + idx_l < size_l) && (large[idx_l + index1] == target1)) {
      buffer[pos++] = target1;
    }
    if ((index2 + idx_l < size_l) && (large[idx_l + index2] == target2)) {
      buffer[pos++] = target2;
    }
    idx_s += 2;
    idx_l += index2;
  }
  if ((idx_s < size_s) && (idx_l < size_l)) {
    uint16_t val_s = small[idx_s];
    int32_t index = binarySearch(large + idx_l, (int32_t)(size_l - idx_l), val_s);
    if (index >= 0)
      buffer[pos++] = val_s;
  }
  return (int32_t)pos;
}